

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_concurrency_test.cc
# Opt level: O2

void multi_file_write_with_inmem_snap(char *test_name)

{
  pthread_t __th;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  fdb_status fVar4;
  int j;
  ulong uVar5;
  int i;
  uint uVar6;
  undefined1 *puVar7;
  char *__format;
  long lVar8;
  ulong uVar9;
  ulong auStack_af0 [4];
  undefined8 uStack_ad0;
  undefined8 auStack_ac8 [3];
  undefined1 auStack_ab0 [8];
  undefined8 auStack_aa8 [30];
  undefined4 auStack_9b8 [4];
  undefined8 uStack_9a8;
  char acStack_9a0 [256];
  undefined1 auStack_8a0 [8];
  undefined8 auStack_898 [214];
  long alStack_1e8 [13];
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined8 local_170;
  void *apvStack_88 [4];
  undefined1 local_68 [8];
  timeval __test_begin;
  
  gettimeofday((timeval *)local_68,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf ./bigfile* > errorlog.txt");
  puVar7 = (undefined1 *)auStack_ac8;
  for (uVar6 = 3; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
    uVar9 = (ulong)uVar6;
    lVar8 = uVar9 * 0x238;
    auStack_ac8[uVar9 * 0x47] = 26000;
    *(undefined8 *)(puVar7 + 0xfffffffffffffff8) = 0x103cdf;
    fdb_get_default_config();
    *(undefined8 *)(puVar7 + 0xfffffffffffffff8) = 0x103cf9;
    memcpy(auStack_ab0 + lVar8,&local_180,0xf8);
    auStack_aa8[uVar9 * 0x47] = 0;
    *(undefined8 *)(puVar7 + 0xfffffffffffffff8) = 0x103d07;
    fdb_get_default_kvs_config();
    (&uStack_9a8)[uVar9 * 0x47] = local_170;
    uVar3 = uStack_174;
    uVar2 = uStack_178;
    uVar1 = uStack_17c;
    auStack_9b8[uVar9 * 0x8e] = local_180;
    auStack_9b8[uVar9 * 0x8e + 1] = uVar1;
    auStack_9b8[uVar9 * 0x8e + 2] = uVar2;
    auStack_9b8[uVar9 * 0x8e + 3] = uVar3;
    auStack_ac8[uVar9 * 0x47 + 1] = 0xa28;
    auStack_8a0[lVar8] = 1;
    alStack_1e8[uVar9 * 3] = 0x40000000a;
    alStack_1e8[uVar9 * 3 + 1] = (long)(puVar7 + 0xffffffffffffffe0);
    *(undefined8 *)(puVar7 + 0xffffffffffffffd8) = 3;
    for (uVar5 = *(ulong *)(puVar7 + 0xffffffffffffffd8); -1 < (int)uVar5;
        uVar5 = (ulong)((int)uVar5 - 1)) {
      *(undefined8 *)(alStack_1e8[uVar9 * 3 + 1] + (uVar5 & 0xffffffff) * 8) = 0;
    }
    auStack_898[uVar9 * 0x47] = alStack_1e8 + uVar9 * 3;
    *(undefined8 *)(auStack_ab0 + lVar8 + -8) = 0x104;
    *(undefined8 *)(puVar7 + 0xffffffffffffffd8) = 0x103da3;
    sprintf(acStack_9a0 + lVar8,"%s_%d","./bigfile",(ulong)uVar6);
    *(undefined8 *)(puVar7 + 0xffffffffffffffd8) = 0x103dbf;
    pthread_create((pthread_t *)(&__test_begin.tv_usec + uVar9),(pthread_attr_t *)0x0,_writer_thread
                   ,auStack_ac8 + uVar9 * 0x47);
    puVar7 = puVar7 + 0xffffffffffffffe0;
  }
  for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 8) {
    __th = *(pthread_t *)((long)&__test_begin.tv_usec + lVar8);
    *(undefined8 *)(puVar7 + 0xfffffffffffffff8) = 0x103de0;
    pthread_join(__th,(void **)((long)apvStack_88 + lVar8));
  }
  *(undefined8 *)(puVar7 + 0xfffffffffffffff8) = 0x103deb;
  fVar4 = fdb_shutdown();
  if (fVar4 == FDB_RESULT_SUCCESS) {
    *(undefined8 *)(puVar7 + 0xfffffffffffffff8) = 0x103df4;
    memleak_end();
    __format = "%s PASSED\n";
    if (multi_file_write_with_inmem_snap(char_const*)::__test_pass != '\0') {
      __format = "%s FAILED\n";
    }
    *(undefined8 *)(puVar7 + 0xfffffffffffffff8) = 0x103e22;
    fprintf(_stderr,__format,test_name);
    return;
  }
  *(undefined8 *)(puVar7 + 0xfffffffffffffff8) = 0x103e58;
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_concurrency_test.cc"
          ,0xef);
  multi_file_write_with_inmem_snap(char_const*)::__test_pass = 1;
  *(code **)(puVar7 + 0xfffffffffffffff8) = _writer_thread;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_concurrency_test.cc"
                ,0xef,"void multi_file_write_with_inmem_snap(const char *)");
}

Assistant:

void multi_file_write_with_inmem_snap(const char *test_name) {
    TEST_INIT();
    memleak_start();

    int num_writers = 4;
    int num_inmem_snaps = 4;
    int inmem_snap_freq = 10;
    int num_docs = NUM_FRUITS*1000;
    int r;
    fdb_status status;
    struct writer_thread_args *wargs = alca(struct writer_thread_args,
                                       num_writers);
    struct shared_data *test_data = alca(struct shared_data, num_writers);
    thread_t *tid = alca(thread_t, num_writers);
    void **thread_ret = alca(void *, num_writers);

    // remove previous test files
    r = system(SHELL_DEL TEST_FILENAME "* > errorlog.txt");
    (void) r;

    for (int i = num_writers - 1; i >= 0; --i) {
        // Writer Thread Config:
        wargs[i].ndocs = num_docs;
        wargs[i].config = fdb_get_default_config();
        wargs[i].config.buffercache_size = 0;
        wargs[i].kvs_config = fdb_get_default_kvs_config();
        wargs[i].batch_size = NUM_FRUITS*100;
        wargs[i].commit_opt = FDB_COMMIT_MANUAL_WAL_FLUSH;
        test_data[i].num_inmem_snaps = num_inmem_snaps;
        test_data[i].inmem_snap_freq = inmem_snap_freq;
        test_data[i].inmem_snaps = alca(fdb_kvs_handle *, num_inmem_snaps);
        for(int j = num_inmem_snaps - 1; j >=0; --j) {
            test_data[i].inmem_snaps[j] = NULL;
        }
        wargs[i].test = &test_data[i];
        wargs[i].clone_frequency = NUM_FRUITS*10;
        sprintf(wargs[i].test_file_name, "%s_%d", TEST_FILENAME, i);

        thread_create(&tid[i], _writer_thread, &wargs[i]);
    }

    // wait for thread termination
    for (int i = 0; i < num_writers; ++i) {
        thread_join(tid[i], &thread_ret[i]);
    }

    // shutdown
    status = fdb_shutdown();
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    memleak_end();
    TEST_RESULT(test_name);
}